

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::TreeNodeExV(char *str_id,ImGuiTreeNodeFlags flags,char *fmt,__va_list_tag *args)

{
  ImGuiContext *pIVar1;
  int iVar2;
  ImGuiID id;
  ImGuiWindow *this;
  char *label_end;
  ImGuiContext *g;
  ImGuiWindow *window;
  __va_list_tag *args_local;
  char *fmt_local;
  ImGuiTreeNodeFlags flags_local;
  char *str_id_local;
  
  this = GetCurrentWindow();
  pIVar1 = GImGui;
  if ((this->SkipItems & 1U) == 0) {
    iVar2 = ImFormatStringV(GImGui->TempBuffer,0xc01,fmt,args);
    id = ImGuiWindow::GetID(this,str_id,(char *)0x0);
    str_id_local._7_1_ = TreeNodeBehavior(id,flags,pIVar1->TempBuffer,pIVar1->TempBuffer + iVar2);
  }
  else {
    str_id_local._7_1_ = false;
  }
  return str_id_local._7_1_;
}

Assistant:

bool ImGui::TreeNodeExV(const char* str_id, ImGuiTreeNodeFlags flags, const char* fmt, va_list args)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const char* label_end = g.TempBuffer + ImFormatStringV(g.TempBuffer, IM_ARRAYSIZE(g.TempBuffer), fmt, args);
    return TreeNodeBehavior(window->GetID(str_id), flags, g.TempBuffer, label_end);
}